

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_tess_level.cpp
# Opt level: O3

ir_visitor_status __thiscall
anon_unknown.dwarf_791d3::lower_tess_level_visitor::visit
          (lower_tess_level_visitor *this,ir_variable *ir)

{
  glsl_type *pgVar1;
  exec_node *peVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  undefined4 extraout_var;
  exec_node *peVar6;
  glsl_type **ppgVar7;
  long lVar8;
  char *pcVar9;
  
  pcVar9 = ir->name;
  if (pcVar9 != (char *)0x0) {
    iVar3 = strcmp(pcVar9,"gl_TessLevelInner");
    if ((iVar3 != 0) && (iVar4 = strcmp(pcVar9,"gl_TessLevelOuter"), iVar4 != 0)) {
      return visit_continue;
    }
    pgVar1 = ir->type;
    if (pgVar1->field_0x4 != '\x11') {
      __assert_fail("ir->type->is_array()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                    ,0x6e,
                    "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                   );
    }
    iVar4 = strcmp(pcVar9,"gl_TessLevelOuter");
    if (iVar4 == 0) {
      if (this->old_tess_level_outer_var != (ir_variable *)0x0) {
        return visit_continue;
      }
      this->old_tess_level_outer_var = ir;
      if ((pgVar1->fields).array != &glsl_type::_float_type) {
        __assert_fail("ir->type->fields.array == glsl_type::float_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x75,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      ppgVar7 = &glsl_type::vec4_type;
      pcVar9 = "gl_TessLevelOuterMESA";
      lVar8 = 0x48;
    }
    else {
      if (iVar3 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x93,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      if (this->old_tess_level_inner_var != (ir_variable *)0x0) {
        return visit_continue;
      }
      this->old_tess_level_inner_var = ir;
      if ((pgVar1->fields).array != &glsl_type::_float_type) {
        __assert_fail("ir->type->fields.array == glsl_type::float_type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                      ,0x86,
                      "virtual ir_visitor_status (anonymous namespace)::lower_tess_level_visitor::visit(ir_variable *)"
                     );
      }
      ppgVar7 = &glsl_type::vec2_type;
      pcVar9 = "gl_TessLevelInnerMESA";
      lVar8 = 0x50;
    }
    pvVar5 = ralloc_parent(ir);
    iVar3 = (*(ir->super_ir_instruction)._vptr_ir_instruction[4])(ir,pvVar5,0);
    *(void **)((long)&(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                      super_ir_hierarchical_visitor._vptr_ir_hierarchical_visitor + lVar8) =
         (void *)CONCAT44(extraout_var,iVar3);
    pcVar9 = ralloc_strdup((void *)CONCAT44(extraout_var,iVar3),pcVar9);
    lVar8 = *(long *)((long)&(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.
                             super_ir_hierarchical_visitor._vptr_ir_hierarchical_visitor + lVar8);
    *(char **)(lVar8 + 0x28) = pcVar9;
    *(glsl_type **)(lVar8 + 0x20) = *ppgVar7;
    *(undefined4 *)(lVar8 + 0x60) = 0;
    peVar6 = (exec_node *)(lVar8 + 8);
    if (lVar8 == 0) {
      peVar6 = (exec_node *)0x0;
    }
    peVar2 = (ir->super_ir_instruction).super_exec_node.prev;
    peVar6->prev = peVar2;
    peVar6->next = (ir->super_ir_instruction).super_exec_node.next;
    peVar2->next = peVar6;
    ((ir->super_ir_instruction).super_exec_node.next)->prev = peVar6;
    (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
    field_0x31 = 1;
  }
  return visit_continue;
}

Assistant:

ir_visitor_status
lower_tess_level_visitor::visit(ir_variable *ir)
{
   if ((!ir->name) ||
       ((strcmp(ir->name, "gl_TessLevelInner") != 0) &&
        (strcmp(ir->name, "gl_TessLevelOuter") != 0)))
      return visit_continue;

   assert (ir->type->is_array());

   if (strcmp(ir->name, "gl_TessLevelOuter") == 0) {
      if (this->old_tess_level_outer_var)
         return visit_continue;

      old_tess_level_outer_var = ir;
      assert(ir->type->fields.array == glsl_type::float_type);

      /* Clone the old var so that we inherit all of its properties */
      new_tess_level_outer_var = ir->clone(ralloc_parent(ir), NULL);

      /* And change the properties that we need to change */
      new_tess_level_outer_var->name = ralloc_strdup(new_tess_level_outer_var,
                                                "gl_TessLevelOuterMESA");
      new_tess_level_outer_var->type = glsl_type::vec4_type;
      new_tess_level_outer_var->data.max_array_access = 0;

      ir->replace_with(new_tess_level_outer_var);
   } else if (strcmp(ir->name, "gl_TessLevelInner") == 0) {
      if (this->old_tess_level_inner_var)
         return visit_continue;

      old_tess_level_inner_var = ir;
      assert(ir->type->fields.array == glsl_type::float_type);

      /* Clone the old var so that we inherit all of its properties */
      new_tess_level_inner_var = ir->clone(ralloc_parent(ir), NULL);

      /* And change the properties that we need to change */
      new_tess_level_inner_var->name = ralloc_strdup(new_tess_level_inner_var,
                                                "gl_TessLevelInnerMESA");
      new_tess_level_inner_var->type = glsl_type::vec2_type;
      new_tess_level_inner_var->data.max_array_access = 0;

      ir->replace_with(new_tess_level_inner_var);
   } else {
      assert(0);
   }

   this->progress = true;

   return visit_continue;
}